

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcElectricDistributionPoint";
  Schema_2x3::IfcFlowController::IfcFlowController
            (&this->super_IfcFlowController,&PTR_construction_vtable_24__009a4248);
  *(undefined8 *)&(this->super_IfcFlowController).field_0x170 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x9a40c8;
  *(undefined8 *)&this->field_0x1c0 = 0x9a4230;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x9a40f0;
  (this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x9a4118;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x9a4140;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x9a4168;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x138 = 0x9a4190;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x148 = 0x9a41b8;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    field_0x158 = 0x9a41e0;
  *(undefined8 *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.field_0x168 =
       0x9a4208;
  *(undefined1 **)&(this->super_IfcFlowController).field_0x178 = &this->field_0x188;
  *(undefined8 *)&this->field_0x180 = 0;
  this->field_0x188 = 0;
  (this->UserDefinedFunction).ptr._M_dataplus._M_p =
       (pointer)&(this->UserDefinedFunction).ptr.field_2;
  (this->UserDefinedFunction).ptr._M_string_length = 0;
  (this->UserDefinedFunction).ptr.field_2._M_local_buf[0] = '\0';
  (this->UserDefinedFunction).have = false;
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}